

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)1>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)1> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  uint32_t *puVar3;
  uint64_t uVar4;
  uint8_t shift;
  uint uVar5;
  int iVar6;
  char cVar7;
  size_t loop;
  long lVar8;
  int32_t xl;
  short sVar9;
  undefined1 auVar10 [64];
  __m512i sumX4;
  type_pun_vec result;
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  local_140 = vmovdqa64_avx512f(auVar10);
  puVar3 = vals->_pData;
  bVar2 = (div->div).denom.more;
  iVar6 = (int)(div->div).denom.magic;
  puVar1 = (uint32_t *)((long)puVar3 + (ulong)vals->_length * 2);
  uVar5 = bVar2 & 0x1f;
  cVar7 = (char)bVar2 >> 7;
  while (puVar3 != puVar1) {
    local_100 = *(undefined8 *)puVar3;
    uStack_f8 = *(undefined8 *)(puVar3 + 2);
    uStack_f0 = *(undefined8 *)(puVar3 + 4);
    uStack_e8 = *(undefined8 *)(puVar3 + 6);
    uStack_e0 = *(undefined8 *)(puVar3 + 8);
    uStack_d8 = *(undefined8 *)(puVar3 + 10);
    uStack_d0 = *(undefined8 *)(puVar3 + 0xc);
    uStack_c8 = *(undefined8 *)(puVar3 + 0xe);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      sVar9 = *(short *)((long)&local_100 + lVar8 * 2);
      sVar9 = (short)((uint)(iVar6 * sVar9) >> 0x10) + sVar9;
      *(ushort *)(local_c0[0] + lVar8 * 2) =
           ((ushort)((int)(short)((sVar9 >> 0xf & (short)(1 << uVar5) - (ushort)(iVar6 == 0)) +
                                 sVar9) >> uVar5) ^ (short)cVar7) - (short)cVar7;
    }
    auVar10 = vpaddw_avx512bw(auVar10,local_c0[0]);
    puVar3 = puVar3 + 0x10;
    local_140 = vmovdqa64_avx512f(auVar10);
  }
  uVar4 = unsigned_sum_vals<short>((short *)local_140,0x20);
  return uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}